

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O3

xmlEntityPtr
xmlCreateEntity(xmlDictPtr dict,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
               xmlChar *content)

{
  int len;
  xmlEntityPtr __s;
  xmlChar *pxVar1;
  
  __s = (xmlEntityPtr)(*xmlMalloc)(0x88);
  if (__s == (xmlEntityPtr)0x0) {
    __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"xmlCreateEntity: malloc failed");
    return (xmlEntityPtr)0x0;
  }
  memset(__s,0,0x88);
  __s->type = XML_ENTITY_DECL;
  __s->etype = type;
  if (dict == (xmlDictPtr)0x0) {
    pxVar1 = xmlStrdup(name);
    __s->name = pxVar1;
    if (ExternalID != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(ExternalID);
      __s->ExternalID = pxVar1;
    }
    if (SystemID == (xmlChar *)0x0) goto LAB_001462f1;
    pxVar1 = xmlStrdup(SystemID);
  }
  else {
    pxVar1 = xmlDictLookup(dict,name,-1);
    __s->name = pxVar1;
    if (ExternalID != (xmlChar *)0x0) {
      pxVar1 = xmlDictLookup(dict,ExternalID,-1);
      __s->ExternalID = pxVar1;
    }
    if (SystemID == (xmlChar *)0x0) goto LAB_001462f1;
    pxVar1 = xmlDictLookup(dict,SystemID,-1);
  }
  __s->SystemID = pxVar1;
LAB_001462f1:
  if (content == (xmlChar *)0x0) {
    __s->length = 0;
    __s->content = (xmlChar *)0x0;
  }
  else {
    len = xmlStrlen(content);
    __s->length = len;
    if (len < 5 && dict != (xmlDictPtr)0x0) {
      pxVar1 = xmlDictLookup(dict,content,len);
    }
    else {
      pxVar1 = xmlStrndup(content,len);
    }
    __s->content = pxVar1;
  }
  __s->URI = (xmlChar *)0x0;
  __s->orig = (xmlChar *)0x0;
  __s->owner = 0;
  return __s;
}

Assistant:

static xmlEntityPtr
xmlCreateEntity(xmlDictPtr dict, const xmlChar *name, int type,
	        const xmlChar *ExternalID, const xmlChar *SystemID,
	        const xmlChar *content) {
    xmlEntityPtr ret;

    ret = (xmlEntityPtr) xmlMalloc(sizeof(xmlEntity));
    if (ret == NULL) {
        xmlEntitiesErrMemory("xmlCreateEntity: malloc failed");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlEntity));
    ret->type = XML_ENTITY_DECL;
    ret->checked = 0;

    /*
     * fill the structure.
     */
    ret->etype = (xmlEntityType) type;
    if (dict == NULL) {
	ret->name = xmlStrdup(name);
	if (ExternalID != NULL)
	    ret->ExternalID = xmlStrdup(ExternalID);
	if (SystemID != NULL)
	    ret->SystemID = xmlStrdup(SystemID);
    } else {
        ret->name = xmlDictLookup(dict, name, -1);
	if (ExternalID != NULL)
	    ret->ExternalID = xmlDictLookup(dict, ExternalID, -1);
	if (SystemID != NULL)
	    ret->SystemID = xmlDictLookup(dict, SystemID, -1);
    }
    if (content != NULL) {
        ret->length = xmlStrlen(content);
	if ((dict != NULL) && (ret->length < 5))
	    ret->content = (xmlChar *)
	                   xmlDictLookup(dict, content, ret->length);
	else
	    ret->content = xmlStrndup(content, ret->length);
     } else {
        ret->length = 0;
        ret->content = NULL;
    }
    ret->URI = NULL; /* to be computed by the layer knowing
			the defining entity */
    ret->orig = NULL;
    ret->owner = 0;

    return(ret);
}